

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hopUtil.c
# Opt level: O1

Hop_Obj_t * Hop_ObjRecognizeMux(Hop_Obj_t *pNode,Hop_Obj_t **ppNodeT,Hop_Obj_t **ppNodeE)

{
  ulong *puVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  int iVar5;
  ulong *puVar6;
  ulong uVar7;
  ulong *puVar8;
  ulong uVar9;
  ulong *puVar10;
  ulong *puVar11;
  
  if (((ulong)pNode & 1) != 0) {
    __assert_fail("!Hop_IsComplement(pNode)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/hop/hopUtil.c"
                  ,0xea,"Hop_Obj_t *Hop_ObjRecognizeMux(Hop_Obj_t *, Hop_Obj_t **, Hop_Obj_t **)");
  }
  iVar5 = Hop_ObjIsMuxType(pNode);
  if (iVar5 != 0) {
    uVar7 = (ulong)pNode->pFanin0 & 0xfffffffffffffffe;
    uVar9 = (ulong)pNode->pFanin1 & 0xfffffffffffffffe;
    puVar1 = (ulong *)(uVar7 + 0x18);
    uVar2 = *(ulong *)(uVar7 + 0x18);
    puVar11 = (ulong *)(uVar9 + 0x18);
    uVar3 = *(ulong *)(uVar9 + 0x18);
    puVar6 = puVar1;
    if (((uVar2 & 0xfffffffffffffffe) == (uVar3 & 0xfffffffffffffffe)) &&
       (((uint)uVar2 & 1) != ((uint)uVar3 & 1))) {
      if ((uVar2 & 1) == 0) {
        *ppNodeT = (Hop_Obj_t *)(*(ulong *)(uVar7 + 0x10) ^ 1);
        puVar11 = (ulong *)(uVar9 + 0x10);
      }
      else {
        *ppNodeT = (Hop_Obj_t *)(*(ulong *)(uVar9 + 0x10) ^ 1);
        puVar6 = puVar11;
        puVar11 = (ulong *)(uVar7 + 0x10);
      }
    }
    else {
      uVar4 = *(ulong *)(uVar7 + 0x10);
      puVar8 = (ulong *)(uVar7 + 0x10);
      uVar7 = *(ulong *)(uVar9 + 0x10);
      puVar10 = (ulong *)(uVar9 + 0x10);
      if (((uVar4 & 0xfffffffffffffffe) == (uVar7 & 0xfffffffffffffffe)) &&
         (((uint)uVar4 & 1) != ((uint)uVar7 & 1))) {
        if ((uVar4 & 1) == 0) {
          *ppNodeT = (Hop_Obj_t *)(uVar2 ^ 1);
          puVar6 = puVar8;
        }
        else {
          *ppNodeT = (Hop_Obj_t *)(uVar3 ^ 1);
          puVar6 = puVar10;
          puVar11 = puVar1;
        }
      }
      else if (((uVar4 & 0xfffffffffffffffe) == (uVar3 & 0xfffffffffffffffe)) &&
              (((uint)uVar4 & 1) != ((uint)uVar3 & 1))) {
        if ((uVar4 & 1) == 0) {
          *ppNodeT = (Hop_Obj_t *)(uVar2 ^ 1);
          puVar6 = puVar8;
          puVar11 = puVar10;
        }
        else {
          *ppNodeT = (Hop_Obj_t *)(uVar7 ^ 1);
          puVar6 = puVar11;
          puVar11 = puVar1;
        }
      }
      else {
        if (((uVar2 & 0xfffffffffffffffe) != (uVar7 & 0xfffffffffffffffe)) ||
           (((uint)uVar2 & 1) == ((uint)uVar7 & 1))) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/hop/hopUtil.c"
                        ,0x131,
                        "Hop_Obj_t *Hop_ObjRecognizeMux(Hop_Obj_t *, Hop_Obj_t **, Hop_Obj_t **)");
        }
        if ((uVar2 & 1) == 0) {
          *ppNodeT = (Hop_Obj_t *)(uVar4 ^ 1);
        }
        else {
          *ppNodeT = (Hop_Obj_t *)(uVar3 ^ 1);
          puVar6 = puVar10;
          puVar11 = puVar8;
        }
      }
    }
    *ppNodeE = (Hop_Obj_t *)(*puVar11 ^ 1);
    return (Hop_Obj_t *)*puVar6;
  }
  __assert_fail("Hop_ObjIsMuxType(pNode)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/hop/hopUtil.c"
                ,0xeb,"Hop_Obj_t *Hop_ObjRecognizeMux(Hop_Obj_t *, Hop_Obj_t **, Hop_Obj_t **)");
}

Assistant:

Hop_Obj_t * Hop_ObjRecognizeMux( Hop_Obj_t * pNode, Hop_Obj_t ** ppNodeT, Hop_Obj_t ** ppNodeE )
{
    Hop_Obj_t * pNode0, * pNode1;
    assert( !Hop_IsComplement(pNode) );
    assert( Hop_ObjIsMuxType(pNode) );
    // get children
    pNode0 = Hop_ObjFanin0(pNode);
    pNode1 = Hop_ObjFanin1(pNode);

    // find the control variable
    if ( Hop_ObjFanin1(pNode0) == Hop_ObjFanin1(pNode1) && (Hop_ObjFaninC1(pNode0) ^ Hop_ObjFaninC1(pNode1)) )
    {
//        if ( Fraig_IsComplement(pNode1->p2) )
        if ( Hop_ObjFaninC1(pNode0) )
        { // pNode2->p2 is positive phase of C
            *ppNodeT = Hop_Not(Hop_ObjChild0(pNode1));//pNode2->p1);
            *ppNodeE = Hop_Not(Hop_ObjChild0(pNode0));//pNode1->p1);
            return Hop_ObjChild1(pNode1);//pNode2->p2;
        }
        else
        { // pNode1->p2 is positive phase of C
            *ppNodeT = Hop_Not(Hop_ObjChild0(pNode0));//pNode1->p1);
            *ppNodeE = Hop_Not(Hop_ObjChild0(pNode1));//pNode2->p1);
            return Hop_ObjChild1(pNode0);//pNode1->p2;
        }
    }
    else if ( Hop_ObjFanin0(pNode0) == Hop_ObjFanin0(pNode1) && (Hop_ObjFaninC0(pNode0) ^ Hop_ObjFaninC0(pNode1)) )
    {
//        if ( Fraig_IsComplement(pNode1->p1) )
        if ( Hop_ObjFaninC0(pNode0) )
        { // pNode2->p1 is positive phase of C
            *ppNodeT = Hop_Not(Hop_ObjChild1(pNode1));//pNode2->p2);
            *ppNodeE = Hop_Not(Hop_ObjChild1(pNode0));//pNode1->p2);
            return Hop_ObjChild0(pNode1);//pNode2->p1;
        }
        else
        { // pNode1->p1 is positive phase of C
            *ppNodeT = Hop_Not(Hop_ObjChild1(pNode0));//pNode1->p2);
            *ppNodeE = Hop_Not(Hop_ObjChild1(pNode1));//pNode2->p2);
            return Hop_ObjChild0(pNode0);//pNode1->p1;
        }
    }
    else if ( Hop_ObjFanin0(pNode0) == Hop_ObjFanin1(pNode1) && (Hop_ObjFaninC0(pNode0) ^ Hop_ObjFaninC1(pNode1)) )
    {
//        if ( Fraig_IsComplement(pNode1->p1) )
        if ( Hop_ObjFaninC0(pNode0) )
        { // pNode2->p2 is positive phase of C
            *ppNodeT = Hop_Not(Hop_ObjChild0(pNode1));//pNode2->p1);
            *ppNodeE = Hop_Not(Hop_ObjChild1(pNode0));//pNode1->p2);
            return Hop_ObjChild1(pNode1);//pNode2->p2;
        }
        else
        { // pNode1->p1 is positive phase of C
            *ppNodeT = Hop_Not(Hop_ObjChild1(pNode0));//pNode1->p2);
            *ppNodeE = Hop_Not(Hop_ObjChild0(pNode1));//pNode2->p1);
            return Hop_ObjChild0(pNode0);//pNode1->p1;
        }
    }
    else if ( Hop_ObjFanin1(pNode0) == Hop_ObjFanin0(pNode1) && (Hop_ObjFaninC1(pNode0) ^ Hop_ObjFaninC0(pNode1)) )
    {
//        if ( Fraig_IsComplement(pNode1->p2) )
        if ( Hop_ObjFaninC1(pNode0) )
        { // pNode2->p1 is positive phase of C
            *ppNodeT = Hop_Not(Hop_ObjChild1(pNode1));//pNode2->p2);
            *ppNodeE = Hop_Not(Hop_ObjChild0(pNode0));//pNode1->p1);
            return Hop_ObjChild0(pNode1);//pNode2->p1;
        }
        else
        { // pNode1->p2 is positive phase of C
            *ppNodeT = Hop_Not(Hop_ObjChild0(pNode0));//pNode1->p1);
            *ppNodeE = Hop_Not(Hop_ObjChild1(pNode1));//pNode2->p2);
            return Hop_ObjChild1(pNode0);//pNode1->p2;
        }
    }
    assert( 0 ); // this is not MUX
    return NULL;
}